

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3BtreeCreateTable(Btree *p,int *piTable,int flags)

{
  int *piVar1;
  BtShared *pBt;
  uint uVar2;
  bool bVar3;
  MemPage *pMVar4;
  u8 eType_00;
  uint uVar5;
  int iVar6;
  BtCursor *pBVar7;
  int iVar8;
  uint nearby;
  int rc;
  u8 eType;
  MemPage *pRoot;
  Pgno pgnoMove;
  MemPage *pPageMove;
  int local_68;
  u8 local_61;
  MemPage *local_60;
  uint local_54;
  uint *local_50;
  Pgno local_44;
  int local_40;
  Pgno local_3c;
  MemPage *local_38;
  
  if ((p->sharable != '\0') && (p->wantToLock = p->wantToLock + 1, p->locked == '\0')) {
    btreeLockCarefully(p);
  }
  pBt = p->pBt;
  if (pBt->autoVacuum == '\0') {
    iVar8 = allocateBtreePage(pBt,&local_60,&local_54,1,'\0');
    local_68 = iVar8;
    if (iVar8 != 0) goto LAB_0013d691;
  }
  else {
    for (pBVar7 = pBt->pCursor; pBVar7 != (BtCursor *)0x0; pBVar7 = pBVar7->pNext) {
      pBVar7->curFlags = pBVar7->curFlags & 0xfb;
    }
    local_50 = (uint *)piTable;
    sqlite3BtreeGetMeta(p,4,&local_54);
    do {
      uVar2 = local_54;
      nearby = uVar2 + 1;
      uVar5 = 0;
      if (1 < nearby) {
        iVar8 = (uVar2 - 1) - (uVar2 - 1) % (pBt->usableSize / 5 + 1);
        uVar5 = iVar8 + (uint)(iVar8 + 1U == (uint)sqlite3PendingByte / pBt->pageSize) + 2;
      }
      local_54 = nearby;
    } while ((nearby == uVar5) || (uVar2 == (uint)sqlite3PendingByte / pBt->pageSize));
    iVar8 = allocateBtreePage(pBt,&local_38,&local_3c,nearby,'\x01');
    local_68 = iVar8;
    if (iVar8 == 0) {
      if (local_3c == nearby) {
        local_60 = local_38;
        iVar8 = local_40;
      }
      else {
        local_61 = '\0';
        local_44 = 0;
        if (pBt->pCursor == (BtCursor *)0x0) {
          iVar6 = 0;
        }
        else {
          iVar6 = saveCursorsOnList(pBt->pCursor,0,(BtCursor *)0x0);
        }
        local_68 = iVar6;
        if (local_38 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_38->pDbPage);
        }
        if ((iVar6 == 0) &&
           (iVar6 = btreeGetPage(pBt,nearby,&local_60,0), local_68 = iVar6, iVar6 == 0)) {
          local_68 = ptrmapGet(pBt,nearby,&local_61,&local_44);
          eType_00 = local_61;
          if ((byte)(local_61 - 1) < 2) {
            sqlite3_log(0xb,"%s at line %d of [%.10s]","database corruption",0x10a06,
                        "8d3a7ea6c5690d6b7c3767558f4f01b511c55463e3f9e64506801fe9b74dce34");
            local_68 = 0xb;
          }
          pMVar4 = local_60;
          if (local_68 != 0) {
joined_r0x0013d727:
            iVar6 = local_68;
            local_68 = iVar6;
            if (pMVar4 != (MemPage *)0x0) {
              sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
            }
            goto LAB_0013d5fb;
          }
          iVar6 = relocatePage(pBt,local_60,eType_00,local_44,local_3c,0);
          local_68 = iVar6;
          if (pMVar4 != (MemPage *)0x0) {
            sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
          }
          if (iVar6 != 0) goto LAB_0013d5fb;
          bVar3 = false;
          iVar8 = btreeGetPage(pBt,nearby,&local_60,0);
          pMVar4 = local_60;
          local_68 = iVar8;
          if (iVar8 == 0) {
            local_68 = sqlite3PagerWrite(local_60->pDbPage);
            if (local_68 != 0) goto joined_r0x0013d727;
            bVar3 = true;
            iVar8 = iVar6;
          }
        }
        else {
LAB_0013d5fb:
          bVar3 = false;
          iVar8 = iVar6;
        }
        if (!bVar3) goto LAB_0013d54e;
      }
      local_40 = iVar8;
      ptrmapPut(pBt,nearby,'\x01',0,&local_68);
      if ((local_68 == 0) && (local_68 = sqlite3BtreeUpdateMeta(p,4,nearby), local_68 == 0)) {
        bVar3 = true;
        piTable = (int *)local_50;
        iVar8 = local_40;
      }
      else {
        piTable = (int *)local_50;
        iVar8 = local_68;
        if (local_60 != (MemPage *)0x0) {
          sqlite3PagerUnrefNotNull(local_60->pDbPage);
        }
        bVar3 = false;
      }
    }
    else {
LAB_0013d54e:
      bVar3 = false;
      piTable = (int *)local_50;
    }
    if (!bVar3) goto LAB_0013d691;
  }
  pMVar4 = local_60;
  zeroPage(local_60,(flags & 1U) * 3 + 10);
  if (pMVar4->pDbPage != (DbPage *)0x0) {
    sqlite3PagerUnrefNotNull(pMVar4->pDbPage);
  }
  *piTable = local_54;
  iVar8 = 0;
LAB_0013d691:
  if (p->sharable != '\0') {
    piVar1 = &p->wantToLock;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      unlockBtreeMutex(p);
    }
  }
  return iVar8;
}

Assistant:

SQLITE_PRIVATE int sqlite3BtreeCreateTable(Btree *p, int *piTable, int flags){
  int rc;
  sqlite3BtreeEnter(p);
  rc = btreeCreateTable(p, piTable, flags);
  sqlite3BtreeLeave(p);
  return rc;
}